

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O3

QAbstractItemView * __thiscall
QColumnViewPrivate::createColumn(QColumnViewPrivate *this,QModelIndex *index,bool show)

{
  uint uVar1;
  int iVar2;
  QWidget *pQVar3;
  QAbstractItemModel *pQVar4;
  void **ppvVar5;
  ulong uVar6;
  QWidgetData *pQVar7;
  QAbstractItemView *pQVar8;
  Connection CVar9;
  char cVar10;
  Representation w;
  int iVar11;
  LayoutDirection LVar12;
  QWidget *pQVar13;
  undefined4 *puVar14;
  QSize QVar15;
  QSize QVar16;
  pointer piVar17;
  long lVar18;
  ulong size;
  long in_FS_OFFSET;
  code *local_e0;
  ImplFn local_d8;
  code *local_d0;
  ImplFn local_c8;
  code *local_c0;
  ImplFn local_b8;
  code *local_b0;
  ImplFn local_a8;
  code *local_a0;
  ImplFn local_98;
  Connection clickedConnection;
  QWidget *local_88;
  TryEmplaceResult local_80;
  undefined1 local_68 [8];
  undefined8 local_60;
  QObject local_58 [8];
  QObject local_50 [8];
  QObject local_48 [8];
  Connection local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = *(QWidget **)
            &(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
             super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  clickedConnection.d_ptr = &DAT_aaaaaaaaaaaaaaaa;
  QMetaObject::Connection::Connection(&clickedConnection);
  pQVar4 = (this->super_QAbstractItemViewPrivate).model;
  cVar10 = (**(code **)(*(long *)pQVar4 + 0x88))(pQVar4,index);
  if (cVar10 == '\0') {
    pQVar13 = (QWidget *)this->previewColumn;
    if (pQVar13 == (QWidget *)0x0) {
      pQVar13 = (QWidget *)operator_new(0x28);
      QWidget::QWidget(pQVar13,pQVar3,(WindowFlags)0x0);
      setPreviewWidget(this,pQVar13);
      pQVar13 = (QWidget *)this->previewColumn;
    }
    local_88 = pQVar13;
    QVar15 = QWidget::minimumSize(pQVar13);
    QVar16 = QWidget::minimumSize(this->previewWidget);
    w.m_i = QVar15.wd.m_i.m_i;
    if (QVar15.wd.m_i.m_i <= QVar16.wd.m_i.m_i) {
      w.m_i = QVar16.wd.m_i.m_i;
    }
    QWidget::setMinimumWidth(pQVar13,w.m_i);
  }
  else {
    pQVar13 = (QWidget *)(**(code **)(*(long *)pQVar3 + 0x300))(pQVar3,index);
    local_68 = (undefined1  [8])QAbstractItemView::clicked;
    local_60._0_4_ = 0;
    local_60._4_4_ = 0;
    local_80.iterator.i.d =
         (Data<QHashPrivate::Node<QAbstractItemView_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>_>
          *)clicked;
    local_80.iterator.i.bucket = 0;
    ppvVar5 = *(void ***)
               &(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                super_QFramePrivate.super_QWidgetPrivate.field_0x8;
    local_88 = pQVar13;
    puVar14 = (undefined4 *)operator_new(0x20);
    *puVar14 = 1;
    *(code **)(puVar14 + 2) =
         QtPrivate::
         QPrivateSlotObject<void_(QColumnViewPrivate::*)(const_QModelIndex_&),_QtPrivate::List<const_QModelIndex_&>,_void>
         ::impl;
    *(code **)(puVar14 + 4) = clicked;
    *(undefined8 *)(puVar14 + 6) = 0;
    QObject::connectImpl
              ((QObject *)&local_a0,(void **)pQVar13,(QObject *)local_68,ppvVar5,
               (QSlotObjectBase *)&local_80,(ConnectionType)puVar14,(int *)0x0,(QMetaObject *)0x0);
    CVar9 = clickedConnection;
    clickedConnection.d_ptr = local_a0;
    local_a0 = (code *)CVar9.d_ptr;
    QMetaObject::Connection::~Connection((Connection *)&local_a0);
  }
  local_a0 = QAbstractItemView::activated;
  local_98 = (ImplFn)0x0;
  local_80.iterator.i.d =
       (Data<QHashPrivate::Node<QAbstractItemView_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>_>
        *)QAbstractItemView::activated;
  local_80.iterator.i.bucket = 0;
  puVar14 = (undefined4 *)operator_new(0x20);
  *puVar14 = 1;
  *(code **)(puVar14 + 2) =
       QtPrivate::
       QCallableObject<void_(QAbstractItemView::*)(const_QModelIndex_&),_QtPrivate::List<const_QModelIndex_&>,_void>
       ::impl;
  *(code **)(puVar14 + 4) = QAbstractItemView::activated;
  *(undefined8 *)(puVar14 + 6) = 0;
  QObject::connectImpl
            ((QObject *)local_68,(void **)pQVar13,(QObject *)&local_80,(void **)pQVar3,
             (QSlotObjectBase *)&local_a0,(ConnectionType)puVar14,(int *)0x0,(QMetaObject *)0x0);
  pQVar13 = local_88;
  local_b0 = QAbstractItemView::clicked;
  local_a8 = (ImplFn)0x0;
  local_80.iterator.i.d =
       (Data<QHashPrivate::Node<QAbstractItemView_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>_>
        *)QAbstractItemView::clicked;
  local_80.iterator.i.bucket = 0;
  puVar14 = (undefined4 *)operator_new(0x20);
  *puVar14 = 1;
  *(code **)(puVar14 + 2) =
       QtPrivate::
       QCallableObject<void_(QAbstractItemView::*)(const_QModelIndex_&),_QtPrivate::List<const_QModelIndex_&>,_void>
       ::impl;
  *(code **)(puVar14 + 4) = QAbstractItemView::clicked;
  *(undefined8 *)(puVar14 + 6) = 0;
  QObject::connectImpl
            ((QObject *)&local_60,(void **)pQVar13,(QObject *)&local_80,(void **)pQVar3,
             (QSlotObjectBase *)&local_b0,(ConnectionType)puVar14,(int *)0x0,(QMetaObject *)0x0);
  local_c0 = QAbstractItemView::doubleClicked;
  local_b8 = (ImplFn)0x0;
  local_80.iterator.i.d =
       (Data<QHashPrivate::Node<QAbstractItemView_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>_>
        *)QAbstractItemView::doubleClicked;
  local_80.iterator.i.bucket = 0;
  puVar14 = (undefined4 *)operator_new(0x20);
  *puVar14 = 1;
  *(code **)(puVar14 + 2) =
       QtPrivate::
       QCallableObject<void_(QAbstractItemView::*)(const_QModelIndex_&),_QtPrivate::List<const_QModelIndex_&>,_void>
       ::impl;
  *(code **)(puVar14 + 4) = QAbstractItemView::doubleClicked;
  *(undefined8 *)(puVar14 + 6) = 0;
  QObject::connectImpl
            (local_58,(void **)pQVar13,(QObject *)&local_80,(void **)pQVar3,
             (QSlotObjectBase *)&local_c0,(ConnectionType)puVar14,(int *)0x0,(QMetaObject *)0x0);
  local_d0 = QAbstractItemView::entered;
  local_c8 = (ImplFn)0x0;
  local_80.iterator.i.d =
       (Data<QHashPrivate::Node<QAbstractItemView_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>_>
        *)QAbstractItemView::entered;
  local_80.iterator.i.bucket = 0;
  puVar14 = (undefined4 *)operator_new(0x20);
  *puVar14 = 1;
  *(code **)(puVar14 + 2) =
       QtPrivate::
       QCallableObject<void_(QAbstractItemView::*)(const_QModelIndex_&),_QtPrivate::List<const_QModelIndex_&>,_void>
       ::impl;
  *(code **)(puVar14 + 4) = QAbstractItemView::entered;
  *(undefined8 *)(puVar14 + 6) = 0;
  QObject::connectImpl
            (local_50,(void **)pQVar13,(QObject *)&local_80,(void **)pQVar3,
             (QSlotObjectBase *)&local_d0,(ConnectionType)puVar14,(int *)0x0,(QMetaObject *)0x0);
  local_e0 = QAbstractItemView::pressed;
  local_d8 = (ImplFn)0x0;
  local_80.iterator.i.d =
       (Data<QHashPrivate::Node<QAbstractItemView_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>_>
        *)QAbstractItemView::pressed;
  local_80.iterator.i.bucket = 0;
  puVar14 = (undefined4 *)operator_new(0x20);
  *puVar14 = 1;
  *(code **)(puVar14 + 2) =
       QtPrivate::
       QCallableObject<void_(QAbstractItemView::*)(const_QModelIndex_&),_QtPrivate::List<const_QModelIndex_&>,_void>
       ::impl;
  *(code **)(puVar14 + 4) = QAbstractItemView::pressed;
  *(undefined8 *)(puVar14 + 6) = 0;
  QObject::connectImpl
            (local_48,(void **)pQVar13,(QObject *)&local_80,(void **)pQVar3,
             (QSlotObjectBase *)&local_e0,(ConnectionType)puVar14,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::Connection(&local_40,&clickedConnection);
  QHash<QAbstractItemView*,std::vector<QMetaObject::Connection,std::allocator<QMetaObject::Connection>>>
  ::tryEmplace_impl<QAbstractItemView*const&>
            (&local_80,
             (QHash<QAbstractItemView*,std::vector<QMetaObject::Connection,std::allocator<QMetaObject::Connection>>>
              *)&this->viewConnections,(QAbstractItemView **)&local_88);
  std::vector<QMetaObject::Connection,std::allocator<QMetaObject::Connection>>::
  _M_assign_aux<QMetaObject::Connection_const*>
            ((vector<QMetaObject::Connection,std::allocator<QMetaObject::Connection>> *)
             ((local_80.iterator.i.d)->spans[local_80.iterator.i.bucket >> 7].entries
              [(local_80.iterator.i.d)->spans[local_80.iterator.i.bucket >> 7].offsets
               [(uint)local_80.iterator.i.bucket & 0x7f]].storage.data + 8),local_68,&local_38);
  lVar18 = 0x28;
  do {
    QMetaObject::Connection::~Connection((Connection *)(local_68 + lVar18));
    lVar18 = lVar18 + -8;
  } while (lVar18 != -8);
  QWidget::setFocusPolicy(local_88,NoFocus);
  QWidget::setParent(local_88,(this->super_QAbstractItemViewPrivate).
                              super_QAbstractScrollAreaPrivate.viewport);
  if (this->showResizeGrips == true) {
    pQVar13 = (QWidget *)operator_new(0x28);
    QColumnViewGrip::QColumnViewGrip((QColumnViewGrip *)pQVar13,local_88);
    QAbstractScrollArea::setCornerWidget((QAbstractScrollArea *)local_88,pQVar13);
    local_68 = (undefined1  [8])QColumnViewGrip::gripMoved;
    local_60._0_4_ = 0;
    local_60._4_4_ = 0;
    local_80.iterator.i.d =
         (Data<QHashPrivate::Node<QAbstractItemView_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>_>
          *)gripMoved;
    local_80.iterator.i.bucket = 0;
    ppvVar5 = *(void ***)
               &(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                super_QFramePrivate.super_QWidgetPrivate.field_0x8;
    puVar14 = (undefined4 *)operator_new(0x20);
    *puVar14 = 1;
    *(code **)(puVar14 + 2) =
         QtPrivate::
         QPrivateSlotObject<void_(QColumnViewPrivate::*)(int),_QtPrivate::List<int>,_void>::impl;
    *(code **)(puVar14 + 4) = gripMoved;
    *(undefined8 *)(puVar14 + 6) = 0;
    QObject::connectImpl
              ((QObject *)&local_a0,(void **)pQVar13,(QObject *)local_68,ppvVar5,
               (QSlotObjectBase *)&local_80,(ConnectionType)puVar14,(int *)0x0,(QMetaObject *)0x0);
    std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>::
    emplace_back<QMetaObject::Connection>(&this->gripConnections,(Connection *)&local_a0);
    QMetaObject::Connection::~Connection((Connection *)&local_a0);
  }
  uVar6 = (this->columns).d.size;
  if (uVar6 < (ulong)(this->columnSizes).d.size) {
    pQVar7 = ((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport)->
             data;
    local_68 = (undefined1  [8])0x0;
    local_60._4_4_ = (pQVar7->crect).y2.m_i - (pQVar7->crect).y1.m_i;
    local_60._0_4_ = (this->columnSizes).d.ptr[uVar6] + -1;
    QWidget::setGeometry(local_88,(QRect *)local_68);
  }
  else {
    iVar11 = (**(code **)(*(long *)local_88 + 0x70))();
    LVar12 = QWidget::layoutDirection(pQVar3);
    pQVar7 = ((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport)->
             data;
    if (LVar12 == RightToLeft) {
      uVar1 = (pQVar7->crect).x1.m_i;
      iVar2 = (pQVar7->crect).x2.m_i;
      local_68._4_4_ = 0;
      local_68._0_4_ = (iVar2 - (uVar1 + iVar11)) + 1;
      local_60._4_4_ = (pQVar7->crect).y2.m_i - (pQVar7->crect).y1.m_i;
      local_60._0_4_ = ~uVar1 + iVar2 + 1;
    }
    else {
      local_68 = (undefined1  [8])0x0;
      local_60._4_4_ = (pQVar7->crect).y2.m_i - (pQVar7->crect).y1.m_i;
      local_60._0_4_ = iVar11 + -1;
    }
    QWidget::setGeometry(local_88,(QRect *)local_68);
    uVar6 = (this->columnSizes).d.size;
    size = (this->columns).d.size + 1;
    if (size < uVar6) {
      size = uVar6;
    }
    QList<int>::resize(&this->columnSizes,size);
    lVar18 = (this->columns).d.size;
    piVar17 = QList<int>::data(&this->columnSizes);
    piVar17[lVar18] = iVar11;
  }
  lVar18 = (this->columns).d.size;
  if (lVar18 == 0) {
    lVar18 = 0;
  }
  else {
    pQVar8 = (this->columns).d.ptr[lVar18 + -1];
    if ((((pQVar8->super_QAbstractScrollArea).super_QFrame.super_QWidget.data)->widget_attributes &
        0x10000) != 0) {
      (**(code **)(*(long *)&(pQVar8->super_QAbstractScrollArea).super_QFrame.super_QWidget + 0x68))
                (pQVar8,1);
      lVar18 = (this->columns).d.size;
    }
  }
  local_68 = (undefined1  [8])local_88;
  QtPrivate::QPodArrayOps<QAbstractItemView*>::emplace<QAbstractItemView*&>
            ((QPodArrayOps<QAbstractItemView*> *)&this->columns,lVar18,
             (QAbstractItemView **)local_68);
  QList<QAbstractItemView_*>::end(&this->columns);
  doLayout(this);
  updateScrollbars(this);
  if ((show) && ((local_88->data->widget_attributes & 0x10000) != 0)) {
    (**(code **)(*(long *)local_88 + 0x68))(local_88,1);
  }
  pQVar3 = local_88;
  QMetaObject::Connection::~Connection(&clickedConnection);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QAbstractItemView *)pQVar3;
  }
  __stack_chk_fail();
}

Assistant:

QAbstractItemView *QColumnViewPrivate::createColumn(const QModelIndex &index, bool show)
{
    Q_Q(QColumnView);
    QAbstractItemView *view = nullptr;
    QMetaObject::Connection clickedConnection;
    if (model->hasChildren(index)) {
        view = q->createColumn(index);
        clickedConnection = QObjectPrivate::connect(view, &QAbstractItemView::clicked,
                                                    this, &QColumnViewPrivate::clicked);
    } else {
        if (!previewColumn)
            setPreviewWidget(new QWidget(q));
        view = previewColumn;
        view->setMinimumWidth(qMax(view->minimumWidth(), previewWidget->minimumWidth()));
    }

    viewConnections[view] = {
        QObject::connect(view, &QAbstractItemView::activated, q, &QColumnView::activated),
        QObject::connect(view, &QAbstractItemView::clicked, q, &QColumnView::clicked),
        QObject::connect(view, &QAbstractItemView::doubleClicked, q, &QColumnView::doubleClicked),
        QObject::connect(view, &QAbstractItemView::entered, q, &QColumnView::entered),
        QObject::connect(view, &QAbstractItemView::pressed, q, &QColumnView::pressed),
        clickedConnection
    };

    view->setFocusPolicy(Qt::NoFocus);
    view->setParent(viewport);
    Q_ASSERT(view);

    // Setup corner grip
    if (showResizeGrips) {
        QColumnViewGrip *grip = new QColumnViewGrip(view);
        view->setCornerWidget(grip);
        gripConnections.push_back(
            QObjectPrivate::connect(grip, &QColumnViewGrip::gripMoved,
                                    this, &QColumnViewPrivate::gripMoved)
        );
    }

    if (columnSizes.size() > columns.size()) {
        view->setGeometry(0, 0, columnSizes.at(columns.size()), viewport->height());
    } else {
        int initialWidth = view->sizeHint().width();
        if (q->isRightToLeft())
            view->setGeometry(viewport->width() - initialWidth, 0, initialWidth, viewport->height());
        else
            view->setGeometry(0, 0, initialWidth, viewport->height());
        columnSizes.resize(qMax(columnSizes.size(), columns.size() + 1));
        columnSizes[columns.size()] = initialWidth;
    }
    if (!columns.isEmpty() && columns.constLast()->isHidden())
        columns.constLast()->setVisible(true);

    columns.append(view);
    doLayout();
    updateScrollbars();
    if (show && view->isHidden())
        view->setVisible(true);
    return view;
}